

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slice.h
# Opt level: O1

uint64_t __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
getFirstTag(SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this)

{
  byte bVar1;
  byte *pbVar2;
  
  pbVar2 = *(byte **)this;
  bVar1 = *pbVar2;
  if ((bVar1 & 0xfe) == 0xee) {
    if (bVar1 == 0xef) {
      return *(uint64_t *)(pbVar2 + 1);
    }
    if (bVar1 == 0xee) {
      return (ulong)pbVar2[1];
    }
  }
  return 0;
}

Assistant:

uint8_t const* getDataPtr() const noexcept { return _start; }